

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O1

bool InsertElem(LinearList *L,ElementType x,int i)

{
  ElementType *pEVar1;
  uint uVar2;
  ulong uVar3;
  
  if (((-1 < i) && (uVar2 = L->Last, i <= (int)uVar2)) && (uVar2 != L->MaxSize)) {
    if (i < (int)uVar2) {
      pEVar1 = L->data;
      do {
        uVar3 = (ulong)uVar2;
        uVar2 = uVar2 - 1;
        pEVar1[uVar3] = pEVar1[uVar2];
      } while (i < (int)uVar2);
    }
    L->data[(uint)i] = x;
    L->Last = L->Last + 1;
    return true;
  }
  return false;
}

Assistant:

bool InsertElem(LinearList *L,ElementType x,int i)  //在表中第i个位置插入值为x的结点
{
    if(i<0 || i > L->Last || L->Last==L->MaxSize)
        return false;  //插入位置不合理，插入失败
    else
    {
        int j;
        for(j = L->Last-1; j >= i; j--)
            L->data[j+1] = L->data[j];  //后移
        L->data[i] = x;  //插入
        L->Last++;       //表长+1
        return true;     //插入成功
    }
}